

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BitsToFloatCaseInstance::getInputValues
          (BitsToFloatCaseInstance *this,int numValues,void **values)

{
  deUint32 dVar1;
  DataType dataType;
  int iVar2;
  const_reference pvVar3;
  float minValue;
  float maxValue;
  Vector<float,_2> local_4c;
  Vec2 range;
  int scalarSize;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  BitsToFloatCaseInstance *this_local;
  
  rnd.m_rnd._8_8_ = values;
  dVar1 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  de::Random::Random((Random *)&scalarSize,dVar1 ^ 0xbbb225);
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar3->varType);
  iVar2 = glu::getDataTypeScalarSize(dataType);
  tcu::Vector<float,_2>::Vector(&local_4c,-1e+08,1e+08);
  minValue = tcu::Vector<float,_2>::x(&local_4c);
  maxValue = tcu::Vector<float,_2>::y(&local_4c);
  fillRandomScalars<float>
            ((Random *)&scalarSize,minValue,maxValue,*(void **)rnd.m_rnd._8_8_,numValues * iVar2,0);
  de::Random::~Random((Random *)&scalarSize);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0xbbb225u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);
		const Vec2				range		(-1e8f, +1e8f);

		// \note Filled as floats.
		fillRandomScalars(rnd, range.x(), range.y(), values[0], numValues*scalarSize);
	}